

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq.hpp
# Opt level: O0

int __thiscall
zmq::detail::socket_base::bind(socket_base *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 in_register_00000034;
  int rc;
  error_t *in_stack_ffffffffffffffe0;
  
  iVar1 = zmq_bind(this->_handle,CONCAT44(in_register_00000034,__fd));
  if (iVar1 != 0) {
    uVar2 = __cxa_allocate_exception(0x10);
    error_t::error_t(in_stack_ffffffffffffffe0);
    __cxa_throw(uVar2,&error_t::typeinfo,error_t::~error_t);
  }
  return iVar1;
}

Assistant:

void bind(const char *addr_)
    {
        int rc = zmq_bind(_handle, addr_);
        if (rc != 0)
            throw error_t();
    }